

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QRectF * __thiscall
QGraphicsItem::mapRectFromScene(QRectF *__return_storage_ptr__,QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *pQVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long in_FS_OFFSET;
  QGraphicsItem *that;
  QGraphicsItem *local_78 [10];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  local_78[0] = pQVar1->q_ptr;
  QGraphicsItemPrivate::ensureSceneTransformRecursive(pQVar1,local_78);
  if ((pQVar1->field_0x167 & 0x40) == 0) {
    QTransform::inverted((bool *)local_78);
    QTransform::mapRect(__return_storage_ptr__);
  }
  else {
    pQVar1 = (this->d_ptr).d;
    dVar2 = (pQVar1->sceneTransform).m_matrix[2][1];
    dVar3 = rect->yp;
    __return_storage_ptr__->xp = rect->xp - (pQVar1->sceneTransform).m_matrix[2][0];
    __return_storage_ptr__->yp = dVar3 - dVar2;
    uVar4 = *(undefined4 *)((long)&rect->w + 4);
    uVar5 = *(undefined4 *)&rect->h;
    uVar6 = *(undefined4 *)((long)&rect->h + 4);
    *(undefined4 *)&__return_storage_ptr__->w = *(undefined4 *)&rect->w;
    *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = uVar4;
    *(undefined4 *)&__return_storage_ptr__->h = uVar5;
    *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = uVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsItem::mapRectFromScene(const QRectF &rect) const
{
    if (d_ptr->hasTranslateOnlySceneTransform())
        return rect.translated(-d_ptr->sceneTransform.dx(), -d_ptr->sceneTransform.dy());
    return d_ptr->sceneTransform.inverted().mapRect(rect);
}